

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_enumerate_devices
              (cubeb_conflict1 *context,cubeb_device_type type,cubeb_device_collection *collection)

{
  int iVar1;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  cubeb_conflict1 *in_RDI;
  char *a_name;
  int r;
  uint32_t max_channels;
  uint32_t rate;
  cubeb_device_info *device;
  uint32_t local_30;
  uint32_t local_2c;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined4 local_14;
  cubeb_conflict1 *local_10;
  int local_4;
  
  local_28 = (undefined8 *)0x0;
  if (in_RDI == (cubeb_conflict1 *)0x0) {
    local_4 = -1;
  }
  else {
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    iVar1 = alsa_get_preferred_sample_rate(in_RDI,&local_2c);
    if (iVar1 == 0) {
      iVar1 = alsa_get_max_channel_count(local_10,&local_30);
      if (iVar1 == 0) {
        local_28 = (undefined8 *)calloc(1,0x58);
        if (local_28 == (undefined8 *)0x0) {
          __assert_fail("device",
                        "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                        ,0x598,
                        "int alsa_enumerate_devices(cubeb *, cubeb_device_type, cubeb_device_collection *)"
                       );
        }
        if (local_28 == (undefined8 *)0x0) {
          local_4 = -1;
        }
        else {
          local_28[1] = "default";
          *local_28 = local_28[1];
          local_28[2] = "default";
          local_28[3] = "default";
          local_28[4] = "default";
          *(undefined4 *)(local_28 + 5) = local_14;
          *(undefined4 *)((long)local_28 + 0x2c) = 2;
          *(undefined4 *)(local_28 + 6) = 0xf;
          *(undefined4 *)((long)local_28 + 0x34) = 0x10;
          *(undefined4 *)(local_28 + 7) = 0x10;
          *(uint32_t *)((long)local_28 + 0x3c) = local_30;
          *(uint32_t *)(local_28 + 9) = local_2c;
          *(uint32_t *)((long)local_28 + 0x44) = local_2c;
          *(uint32_t *)(local_28 + 8) = local_2c;
          *(undefined4 *)((long)local_28 + 0x4c) = 0;
          *(undefined4 *)(local_28 + 10) = 0;
          *local_20 = local_28;
          local_20[1] = 1;
          local_4 = 0;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int
alsa_enumerate_devices(cubeb * context, cubeb_device_type type,
                       cubeb_device_collection * collection)
{
  cubeb_device_info * device = NULL;

  if (!context)
    return CUBEB_ERROR;

  uint32_t rate, max_channels;
  int r;

  r = alsa_get_preferred_sample_rate(context, &rate);
  if (r != CUBEB_OK) {
    return CUBEB_ERROR;
  }

  r = alsa_get_max_channel_count(context, &max_channels);
  if (r != CUBEB_OK) {
    return CUBEB_ERROR;
  }

  char const * a_name = "default";
  device = (cubeb_device_info *)calloc(1, sizeof(cubeb_device_info));
  assert(device);
  if (!device)
    return CUBEB_ERROR;

  device->device_id = a_name;
  device->devid = (cubeb_devid)device->device_id;
  device->friendly_name = a_name;
  device->group_id = a_name;
  device->vendor_name = a_name;
  device->type = type;
  device->state = CUBEB_DEVICE_STATE_ENABLED;
  device->preferred = CUBEB_DEVICE_PREF_ALL;
  device->format = CUBEB_DEVICE_FMT_S16NE;
  device->default_format = CUBEB_DEVICE_FMT_S16NE;
  device->max_channels = max_channels;
  device->min_rate = rate;
  device->max_rate = rate;
  device->default_rate = rate;
  device->latency_lo = 0;
  device->latency_hi = 0;

  collection->device = device;
  collection->count = 1;

  return CUBEB_OK;
}